

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintTo(char *s,ostream *os)

{
  ostream *os_local;
  char *s_local;
  
  anon_unknown_32::PrintCStringTo<char>(s,os);
  return;
}

Assistant:

void PrintTo(const char* s, ostream* os) { PrintCStringTo(s, os); }